

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_build.c
# Opt level: O0

int OSSL_PARAM_BLD_push_utf8_string(OSSL_PARAM_BLD *bld,char *key,char *buf,size_t bsize)

{
  int type;
  OSSL_PARAM_BLD_DEF *pOVar1;
  size_t in_RCX;
  char *in_RDX;
  OSSL_PARAM_BLD *in_RSI;
  int secure;
  OSSL_PARAM_BLD_DEF *pd;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  int size;
  uint local_4;
  
  if (in_RCX == 0) {
    in_RCX = strlen(in_RDX);
  }
  else if (0x7fffffff < in_RCX) {
    ERR_new();
    ERR_set_debug(in_RDX,(int)(in_RCX >> 0x20),in_stack_ffffffffffffffd0);
    ERR_set_error(0xf,0x70,(char *)0x0);
    return 0;
  }
  size = (int)(in_RCX >> 0x20);
  type = CRYPTO_secure_allocated
                   ((void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  pOVar1 = param_push(in_RSI,in_RDX,size,(size_t)in_stack_ffffffffffffffd0,type,
                      in_stack_ffffffffffffffc8);
  if (pOVar1 != (OSSL_PARAM_BLD_DEF *)0x0) {
    pOVar1->string = in_RDX;
  }
  local_4 = (uint)(pOVar1 != (OSSL_PARAM_BLD_DEF *)0x0);
  return local_4;
}

Assistant:

int OSSL_PARAM_BLD_push_utf8_string(OSSL_PARAM_BLD *bld, const char *key,
                                    const char *buf, size_t bsize)
{
    OSSL_PARAM_BLD_DEF *pd;
    int secure;

    if (bsize == 0) {
        bsize = strlen(buf);
    } else if (bsize > INT_MAX) {
        ERR_raise(ERR_LIB_CRYPTO, CRYPTO_R_STRING_TOO_LONG);
        return 0;
    }
    secure = CRYPTO_secure_allocated(buf);
    pd = param_push(bld, key, bsize, bsize + 1, OSSL_PARAM_UTF8_STRING, secure);
    if (pd == NULL)
        return 0;
    pd->string = buf;
    return 1;
}